

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O2

void ImGui::ShowUserGuide(void)

{
  ImGuiIO *pIVar1;
  
  pIVar1 = GetIO();
  BulletText("Double-click on title bar to collapse window.");
  BulletText(
            "Click and drag on lower corner to resize window\n(double-click to auto fit window to its contents)."
            );
  BulletText("CTRL+Click on a slider or drag box to input value as text.");
  BulletText("TAB/SHIFT+TAB to cycle through keyboard editable fields.");
  BulletText("CTRL+Tab to select a window.");
  if (pIVar1->FontAllowUserScaling == true) {
    BulletText("CTRL+Mouse Wheel to zoom window contents.");
  }
  BulletText("While inputing text:\n");
  Indent(0.0);
  BulletText("CTRL+Left/Right to word jump.");
  BulletText("CTRL+A or double-click to select all.");
  BulletText("CTRL+X/C/V to use clipboard cut/copy/paste.");
  BulletText("CTRL+Z,CTRL+Y to undo/redo.");
  BulletText("ESCAPE to revert.");
  Unindent(0.0);
  BulletText("With keyboard navigation enabled:");
  Indent(0.0);
  BulletText("Arrow keys to navigate.");
  BulletText("Space to activate a widget.");
  BulletText("Return to input text into a widget.");
  BulletText("Escape to deactivate a widget, close popup, exit child window.");
  BulletText("Alt to jump to the menu layer of a window.");
  Unindent(0.0);
  return;
}

Assistant:

void ImGui::ShowUserGuide()
{
    ImGuiIO& io = ImGui::GetIO();
    ImGui::BulletText("Double-click on title bar to collapse window.");
    ImGui::BulletText(
        "Click and drag on lower corner to resize window\n"
        "(double-click to auto fit window to its contents).");
    ImGui::BulletText("CTRL+Click on a slider or drag box to input value as text.");
    ImGui::BulletText("TAB/SHIFT+TAB to cycle through keyboard editable fields.");
	ImGui::BulletText("CTRL+Tab to select a window.");
	if (io.FontAllowUserScaling)
        ImGui::BulletText("CTRL+Mouse Wheel to zoom window contents.");
    ImGui::BulletText("While inputing text:\n");
    ImGui::Indent();
    ImGui::BulletText("CTRL+Left/Right to word jump.");
    ImGui::BulletText("CTRL+A or double-click to select all.");
    ImGui::BulletText("CTRL+X/C/V to use clipboard cut/copy/paste.");
    ImGui::BulletText("CTRL+Z,CTRL+Y to undo/redo.");
    ImGui::BulletText("ESCAPE to revert.");
    ImGui::Unindent();
    ImGui::BulletText("With keyboard navigation enabled:");
    ImGui::Indent();
    ImGui::BulletText("Arrow keys to navigate.");
    ImGui::BulletText("Space to activate a widget.");
    ImGui::BulletText("Return to input text into a widget.");
    ImGui::BulletText("Escape to deactivate a widget, close popup, exit child window.");
    ImGui::BulletText("Alt to jump to the menu layer of a window.");
    ImGui::Unindent();
}